

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void linenoisePathCompletion(char *buf,char *hint,linenoiseCompletions *lc)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  size_t sVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  char local_10d8 [8];
  char match [4098];
  undefined1 local_c8 [8];
  stat st;
  
  lc->path = 1;
  st.__glibc_reserved[2] = (__syscall_slong_t)lc;
  pcVar2 = strrchr(hint,0x2f);
  if (pcVar2 == (char *)0x0) {
    __s = (char *)malloc(0x1003);
    __s[0] = '.';
    __s[1] = '/';
    __s[2] = '\0';
  }
  else {
    __s = (char *)malloc((long)(((int)pcVar2 - (int)hint) + 0x1001));
    sprintf(__s,"%.*s",(ulong)(uint)((int)(pcVar2 + 1) - (int)hint),hint);
    hint = pcVar2 + 1;
  }
  sVar3 = strlen(__s);
  __dirp = opendir(__s);
  if (__dirp != (DIR *)0x0) {
    pdVar4 = readdir(__dirp);
    if (pdVar4 != (dirent *)0x0) {
      do {
        if (pdVar4->d_name[0] != '.') {
          pcVar2 = pdVar4->d_name;
          sVar5 = strlen(hint);
          iVar1 = strncmp(hint,pcVar2,sVar5);
          if (iVar1 == 0) {
            strcpy(__s + sVar3,pcVar2);
            iVar1 = stat(__s,(stat *)local_c8);
            if (iVar1 == 0) {
              strcpy(local_10d8,pcVar2);
              if (((uint)st.st_nlink & 0xf000) == 0x4000) {
                sVar5 = strlen(local_10d8);
                (local_10d8 + sVar5)[0] = '/';
                (local_10d8 + sVar5)[1] = '\0';
              }
              linenoiseAddCompletion((linenoiseCompletions *)st.__glibc_reserved[2],local_10d8);
            }
          }
        }
        pdVar4 = readdir(__dirp);
      } while (pdVar4 != (dirent *)0x0);
    }
    free(__s);
    closedir(__dirp);
    return;
  }
  free(__s);
  return;
}

Assistant:

void linenoisePathCompletion(const char *buf, const char *hint, linenoiseCompletions *lc) {
    const char *ptr;
    char *full_path, *hint_ptr, match[FILENAME_MAX + 2];
    DIR *dir;
    struct dirent *ent;
    struct stat st;

    (void)buf;

    lc->path = 1;

    ptr = strrchr(hint, '/');

    /* new relative path */
    if (ptr == NULL) {
        full_path = malloc(2 + FILENAME_MAX + 1);
        strcpy(full_path, "./");

        ptr = hint;
    } else {
        full_path = malloc((int)(ptr - hint) + FILENAME_MAX + 1);
        ++ptr;
        sprintf(full_path, "%.*s", (int)(ptr - hint), hint);
    }
    hint_ptr = full_path + strlen(full_path);

    dir = opendir(full_path);
    if (dir == NULL) {
        free(full_path);
        return;
    }

    while ((ent = readdir(dir))) {
        if (ent->d_name[0] == '.') {
            continue;
        }

        if (!strncmp(ptr, ent->d_name, strlen(ptr))) {
            /* is it a directory? */
            strcpy(hint_ptr, ent->d_name);
            if (stat(full_path, &st)) {
                /* skip this item */
                continue;
            }

            strcpy(match, ent->d_name);
            if (S_ISDIR(st.st_mode)) {
                strcat(match, "/");
            }

            linenoiseAddCompletion(lc, match);
        }
    }

    free(full_path);
    closedir(dir);
}